

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uchar paethPredictor(short a,short b,short c)

{
  uint uVar1;
  uchar uVar2;
  undefined6 in_register_00000012;
  undefined2 in_register_00000032;
  uchar uVar3;
  undefined6 in_register_0000003a;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar6 = (uint)CONCAT62(in_register_0000003a,a);
  uVar7 = (uint)CONCAT62(in_register_00000012,c);
  uVar5 = uVar7 & 0xffff;
  uVar4 = (ushort)b - uVar5;
  uVar1 = -uVar4;
  if (0 < (int)uVar4) {
    uVar1 = uVar4;
  }
  uVar5 = (uVar6 & 0xffff) - uVar5;
  uVar4 = -uVar5;
  if (0 < (int)uVar5) {
    uVar4 = uVar5;
  }
  uVar7 = CONCAT22(in_register_00000032,b) + uVar6 + uVar7 * -2;
  uVar6 = -uVar7;
  if (0 < (int)uVar7) {
    uVar6 = uVar7;
  }
  uVar3 = (uchar)a;
  if ((uVar4 & 0xffff) < (uVar1 & 0xffff)) {
    uVar3 = (uchar)b;
  }
  uVar2 = (uchar)c;
  if ((uVar4 & 0xffff) <= (uVar6 & 0xffff)) {
    uVar2 = uVar3;
  }
  if ((uVar1 & 0xffff) <= (uVar6 & 0xffff)) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

static unsigned char paethPredictor(short a, short b, short c)
{
  short pa = abs(b - c);
  short pb = abs(a - c);
  short pc = abs(a + b - c - c);

  if(pc < pa && pc < pb) return (unsigned char)c;
  else if(pb < pa) return (unsigned char)b;
  else return (unsigned char)a;
}